

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Request::~Request(Request *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  DataHandlerBase *pDVar3;
  _Manager_type p_Var4;
  _Head_base<0UL,_restincurl::EasyHandle_*,_false> __ptr_00;
  pointer *__ptr;
  
  if (this->headers_ != (headers_t)0x0) {
    curl_slist_free_all();
  }
  this_00 = (this->fp_).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->default_data_buffer_)._M_dataplus._M_p;
  paVar1 = &(this->default_data_buffer_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pDVar3 = (this->default_in_handler_)._M_t.
           super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
           .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl;
  if (pDVar3 != (DataHandlerBase *)0x0) {
    (*pDVar3->_vptr_DataHandlerBase[1])();
  }
  (this->default_in_handler_)._M_t.
  super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
  .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl = (DataHandlerBase *)0x0
  ;
  pDVar3 = (this->default_out_handler_)._M_t.
           super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
           .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl;
  if (pDVar3 != (DataHandlerBase *)0x0) {
    (*pDVar3->_vptr_DataHandlerBase[1])();
  }
  (this->default_out_handler_)._M_t.
  super___uniq_ptr_impl<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_restincurl::DataHandlerBase_*,_std::default_delete<restincurl::DataHandlerBase>_>
  .super__Head_base<0UL,_restincurl::DataHandlerBase_*,_false>._M_head_impl = (DataHandlerBase *)0x0
  ;
  p_Var4 = (this->completion_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->completion_,(_Any_data *)&this->completion_,__destroy_functor);
  }
  __ptr_00._M_head_impl =
       (this->eh_)._M_t.
       super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>.
       _M_t.
       super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
       .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (EasyHandle *)0x0) {
    std::default_delete<restincurl::EasyHandle>::operator()
              ((default_delete<restincurl::EasyHandle> *)this,__ptr_00._M_head_impl);
  }
  (this->eh_)._M_t.
  super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>._M_t.
  super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>.
  super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl = (EasyHandle *)0x0;
  return;
}

Assistant:

~Request() {
            if (headers_) {
                curl_slist_free_all(headers_);
            }
        }